

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void flush_before_commit_test(void)

{
  fdb_doc **ppfVar1;
  fdb_status fVar2;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  long lVar3;
  char *__format;
  ulong uVar4;
  fdb_file_handle *dbfile_txn;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_txn;
  fdb_kvs_handle *db;
  fdb_doc **local_560;
  timeval __test_begin;
  fdb_doc *local_548 [31];
  fdb_kvs_config kvs_config;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 5;
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fconfig.compaction_threshold = '\0';
  fconfig.wal_flush_before_commit = true;
  fdb_open(&dbfile,"dummy1",&fconfig);
  fdb_open(&dbfile_txn,"dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fdb_kvs_open_default(dbfile_txn,&db_txn,&kvs_config);
  fVar2 = fdb_set_log_callback(db_txn,logCallbackFunc,"flush_before_commit_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    local_560 = local_548;
    for (uVar4 = 0; uVar4 != 0x1e; uVar4 = uVar4 + 1) {
      sprintf(keybuf,"key%d",uVar4 & 0xffffffff);
      sprintf(metabuf,"meta%d",uVar4 & 0xffffffff);
      sprintf(bodybuf,"body%d",uVar4 & 0xffffffff);
      keylen = strlen(keybuf);
      metalen = strlen(metabuf);
      bodylen = strlen(bodybuf);
      ppfVar1 = local_560;
      fdb_doc_create(local_560,keybuf,keylen,metabuf,metalen,bodybuf,bodylen);
      local_560 = ppfVar1 + 1;
    }
    fdb_begin_transaction(dbfile_txn,'\x02');
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db,local_548[lVar3]);
    }
    fdb_commit(dbfile,'\0');
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db_txn,local_548[lVar3]);
    }
    fdb_end_transaction(dbfile_txn,'\0');
    fdb_commit(dbfile,'\x01');
    fdb_begin_transaction(dbfile_txn,'\x02');
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db_txn,local_548[lVar3]);
    }
    fdb_end_transaction(dbfile_txn,'\0');
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db,local_548[lVar3]);
    }
    fdb_commit(dbfile,'\0');
    fdb_commit(dbfile,'\x01');
    fdb_begin_transaction(dbfile_txn,'\x02');
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db_txn,local_548[lVar3]);
    }
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db,local_548[lVar3]);
    }
    fdb_commit(dbfile,'\0');
    fdb_end_transaction(dbfile_txn,'\0');
    fdb_commit(dbfile,'\x01');
    fdb_begin_transaction(dbfile_txn,'\x02');
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db,local_548[lVar3]);
    }
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fdb_set(db_txn,local_548[lVar3]);
    }
    fdb_end_transaction(dbfile_txn,'\0');
    fdb_commit(dbfile,'\0');
    fdb_commit(dbfile,'\x01');
    fdb_begin_transaction(dbfile_txn,'\x02');
    for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
      fdb_set(db_txn,local_548[lVar3]);
    }
    for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
      fdb_set(db,local_548[lVar3 + 10]);
    }
    fdb_compact(dbfile,"dummy2");
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      fdb_set(db_txn,local_548[lVar3 + 0x14]);
    }
    fdb_end_transaction(dbfile_txn,'\0');
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      fdb_set(db,local_548[lVar3 + 0x19]);
    }
    fdb_close(dbfile);
    fdb_close(dbfile_txn);
    for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
      fdb_doc_free(local_548[lVar3]);
    }
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"flush before commit test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xdba);
  flush_before_commit_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xdba,"void flush_before_commit_test()");
}

Assistant:

void flush_before_commit_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile_txn;
    fdb_kvs_handle *db, *db_txn;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 5;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;
    fconfig.wal_flush_before_commit = true;

    // open db
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn, &db_txn, &kvs_config);
    status = fdb_set_log_callback(db_txn, logCallbackFunc,
                                  (void *) "flush_before_commit_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
    }

    // non-transactional commit first, transactional commit next
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // transactional commit first, non-transactional commit next
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // concurrent update (non-txn commit first, txn commit next)
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // concurrent update (txn commit first, non-txn commit next)
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // begin transaction
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);

    // insert docs using transaction
    for (i=0;i<10;++i){
        fdb_set(db_txn, doc[i]);
    }

    // insert docs without transaction
    for (i=10;i<20;++i){
        fdb_set(db, doc[i]);
    }

    // do compaction
    fdb_compact(dbfile, "dummy2");

    for (i=20;i<25;++i){
        fdb_set(db_txn, doc[i]);
    }
    // end transaction
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);

    for (i=25;i<30;++i){
        fdb_set(db, doc[i]);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("flush before commit test");
}